

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall
curlpp::CallbackException<curlpp::LogicError>::~CallbackException
          (CallbackException<curlpp::LogicError> *this)

{
  CallbackException<curlpp::LogicError> *in_RDI;
  
  ~CallbackException(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

class CURLPPAPI CallbackException : public CallbackExceptionBase
	{

	public: 

		typedef CallbackException<ExceptionType> _CE;

		CallbackException(const ExceptionType & e) 
			: mException(e)
		{}

		virtual void throwMe() 
		{
			throw mException;
		}

		virtual _CE * clone() 
		{
			return new _CE(*this);
		}

	private:

		ExceptionType mException;

	}